

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::exceptionsThrow(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  errorCodes ec;
  uint uVar2;
  ulong uVar3;
  ForthStack<unsigned_int> *this_01;
  string local_50;
  
  this_00 = &this->dStack;
  ec = ForthStack<unsigned_int>::getTop(this_00);
  if (ec == ~errorAbort) {
    ForthStack<unsigned_int>::pop(this_00);
    return;
  }
  if ((4 < this->exceptionHandler) && (4 < (this->catchStack).top)) {
    this_01 = &this->catchStack;
    while (this->exceptionHandler < (this->catchStack).top) {
      ForthStack<unsigned_int>::pop(this_01);
    }
    uVar2 = ForthStack<unsigned_int>::getTop(this_01);
    this->exceptionHandler = uVar2;
    ForthStack<unsigned_int>::pop(this_01);
    uVar2 = ForthStack<unsigned_int>::getTop(this_01);
    ForthStack<unsigned_int>::pop(this_01);
    uVar3 = ((long)(this->savedInput).
                   super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->savedInput).
                   super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
    if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
      std::
      vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
      ::resize(&this->savedInput,(ulong)(uVar2 + 1));
      RestoreInput(this);
    }
    uVar2 = ForthStack<unsigned_int>::getTop(this_01);
    ForthStack<unsigned_int>::pop(this_01);
    if (uVar2 < (this->returnStack).top) {
      do {
        ForthStack<unsigned_int>::pop(&this->returnStack);
      } while (uVar2 < (this->returnStack).top);
    }
    uVar2 = ForthStack<unsigned_int>::getTop(this_01);
    ForthStack<unsigned_int>::pop(this_01);
    while (uVar2 < (this->rStack).top) {
      ForthStack<unsigned_int>::pop(&this->rStack);
    }
    while ((this->rStack).top < uVar2) {
      ForthStack<unsigned_int>::push(&this->rStack,0);
    }
    uVar2 = ForthStack<unsigned_int>::getTop(this_01);
    do {
      ForthStack<unsigned_int>::pop(this_01);
      this_01 = this_00;
    } while (uVar2 < (this->dStack).top);
    while ((this->dStack).top < uVar2) {
      ForthStack<unsigned_int>::push(this_00,0);
    }
    returnStackRestore(this);
    ForthStack<unsigned_int>::push(this_00,ec);
    return;
  }
  paVar1 = &local_50.field_2;
  if (ec == errorAbort) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    throwCppExceptionMessage(this,&local_50,errorAbort);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  throwCppExceptionMessage(this,&local_50,ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void exceptionsThrow(){
			SCell exceptionNumber = static_cast<SCell>(dStack.getTop()); 
			if (exceptionNumber != 0){
				if (exceptionHandler >= 5 && catchStack.stackDepth() >= 5){
					while (catchStack.stackDepth() > exceptionHandler) catchStack.pop();
					exceptionHandler = catchStack.getTop(); catchStack.pop();
					auto sourceSaveDepth = catchStack.getTop(); catchStack.pop();
					if (sourceSaveDepth < savedInput.size()) {
						savedInput.resize(sourceSaveDepth + 1);
						RestoreInput();
					}
					auto returnDepth = catchStack.getTop(); catchStack.pop();
					while (returnStack.stackDepth() > returnDepth) returnStack.pop();
					auto rDepth = catchStack.getTop(); catchStack.pop();
					while (rStack.stackDepth() > rDepth) rStack.pop();
					while (rStack.stackDepth() < rDepth) rStack.push(0);
					auto dDepth = catchStack.getTop(); catchStack.pop();
					while (dStack.stackDepth() > dDepth) dStack.pop();
					while (dStack.stackDepth() < dDepth) dStack.push(0);

					returnStackRestore();
					dStack.push(exceptionNumber);
				}
				else {
					if (exceptionNumber == -1){
						throwCppExceptionMessage("",static_cast<Forth::errorCodes>(exceptionNumber));
					}
					throwCppExceptionMessage("",static_cast<Forth::errorCodes>(exceptionNumber));
				}
			}
			else {
				dStack.pop();
			}
		}